

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O0

bool Js::EquivalentTypeSet::AreIdentical(EquivalentTypeSet *left,EquivalentTypeSet *right)

{
  JITTypeHolderBase<Memory::Recycler> *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JITTypeHolderBase<Memory::Recycler> **ppJVar5;
  uint local_24;
  uint i;
  EquivalentTypeSet *right_local;
  EquivalentTypeSet *left_local;
  
  bVar3 = GetSortedAndDuplicatesRemoved(left);
  if (!bVar3) {
    SortAndRemoveDuplicates(left);
  }
  bVar3 = GetSortedAndDuplicatesRemoved(right);
  if (!bVar3) {
    SortAndRemoveDuplicates(right);
  }
  bVar3 = GetSortedAndDuplicatesRemoved(left);
  if ((!bVar3) || (bVar3 = GetSortedAndDuplicatesRemoved(right), !bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EquivalentTypeSet.cpp"
                                ,0x41,
                                "(left->GetSortedAndDuplicatesRemoved() && right->GetSortedAndDuplicatesRemoved())"
                                ,
                                "left->GetSortedAndDuplicatesRemoved() && right->GetSortedAndDuplicatesRemoved()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (left->count == right->count) {
    for (local_24 = 0; local_24 < left->count; local_24 = local_24 + 1) {
      ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                          ((WriteBarrierPtr *)&left->types);
      pJVar1 = *ppJVar5;
      ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                          ((WriteBarrierPtr *)&right->types);
      bVar3 = JITTypeHolderBase<Memory::Recycler>::operator!=(pJVar1 + local_24,*ppJVar5 + local_24)
      ;
      if (bVar3) {
        return false;
      }
    }
    left_local._7_1_ = true;
  }
  else {
    left_local._7_1_ = false;
  }
  return left_local._7_1_;
}

Assistant:

bool EquivalentTypeSet::AreIdentical(EquivalentTypeSet * left, EquivalentTypeSet * right)
{
    if (!left->GetSortedAndDuplicatesRemoved())
    {
        left->SortAndRemoveDuplicates();
    }
    if (!right->GetSortedAndDuplicatesRemoved())
    {
        right->SortAndRemoveDuplicates();
    }

    Assert(left->GetSortedAndDuplicatesRemoved() && right->GetSortedAndDuplicatesRemoved());

    if (left->count != right->count)
    {
        return false;
    }

    // TODO: OOP JIT, optimize this (previously we had memcmp)
    for (uint i = 0; i < left->count; ++i)
    {
        if (left->types[i] != right->types[i])
        {
            return false;
        }
    }
    return true;
}